

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

uint qNumVariantToHelper<unsigned_int>(Private *d,bool *ok)

{
  undefined1 *puVar1;
  bool bVar2;
  uint uVar3;
  long in_FS_OFFSET;
  uint ret;
  QMetaType local_28;
  QMetaType local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<unsigned_int>::metaType;
  if (ok != (bool *)0x0) {
    *ok = true;
  }
  local_28.d_ptr = (QMetaTypeInterface *)(*(ulong *)&d->field_0x18 & 0xfffffffffffffffc);
  bVar2 = comparesEqual(&local_28,&local_20);
  if (bVar2) {
    if ((d->field_0x18 & 1) != 0) {
      d = (Private *)
          ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
                  ._q_value.super___atomic_base<int>._M_i + (long)((d->data).shared)->offset);
    }
    uVar3 = *(uint *)&d->data;
  }
  else {
    local_28.d_ptr = local_28.d_ptr & 0xffffffff00000000;
    puVar1 = &d->field_0x18;
    if ((*(ulong *)puVar1 & 1) != 0) {
      d = (Private *)
          ((long)&(((d->data).shared)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
                  ._q_value.super___atomic_base<int>._M_i + (long)((d->data).shared)->offset);
    }
    bVar2 = QMetaType::convert((QMetaTypeInterface *)(*(ulong *)puVar1 & 0xfffffffffffffffc),d,
                               local_20,&local_28);
    if (ok != (bool *)0x0) {
      *ok = bVar2;
    }
    uVar3 = (uint)local_28.d_ptr;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return uVar3;
  }
  __stack_chk_fail();
}

Assistant:

inline T qNumVariantToHelper(const QVariant::Private &d, bool *ok)
{
    QMetaType t = QMetaType::fromType<T>();
    if (ok)
        *ok = true;

    if (d.type() == t)
        return d.get<T>();

    T ret = 0;
    bool success = QMetaType::convert(d.type(), d.storage(), t, &ret);
    if (ok)
        *ok = success;
    return ret;
}